

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsKeyDown(int user_key_index)

{
  if (user_key_index < 0) {
    return false;
  }
  if ((uint)user_key_index < 0x200) {
    return (GImGui->IO).KeysDown[(uint)user_key_index];
  }
  __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*g.IO.KeysDown)))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                ,0x10c7,"bool ImGui::IsKeyDown(int)");
}

Assistant:

bool ImGui::IsKeyDown(int user_key_index)
{
    if (user_key_index < 0)
        return false;
    ImGuiContext& g = *GImGui;
    IM_ASSERT(user_key_index >= 0 && user_key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    return g.IO.KeysDown[user_key_index];
}